

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O2

void __thiscall Tank::initialize(Tank *this,Network *nw)

{
  double dVar1;
  double dVar2;
  
  dVar2 = (this->super_Node).initQual;
  dVar1 = this->initHead;
  (this->super_Node).head = dVar1;
  this->pastHead = dVar1;
  (this->super_Node).outflow = 0.0;
  this->pastOutflow = 0.0;
  (this->super_Node).quality = dVar2;
  updateArea(this);
  if (this->volCurve == (Curve *)0x0) {
    if ((this->minVolume != 0.0) || (NAN(this->minVolume))) goto LAB_0012f084;
    dVar2 = (this->minHead - (this->super_Node).elev) * this->area;
  }
  else {
    dVar2 = findVolume(this,this->minHead);
  }
  this->minVolume = dVar2;
LAB_0012f084:
  dVar2 = findVolume(this,(this->super_Node).head);
  this->volume = dVar2;
  dVar2 = findVolume(this,this->maxHead);
  this->maxVolume = dVar2;
  (this->super_Node).fixedGrade = true;
  return;
}

Assistant:

void Tank::initialize(Network* nw)
{
    head = initHead;
    pastHead = initHead;
    outflow = 0.0;
    pastOutflow = 0.0;
    quality = initQual;
    updateArea();
    if ( volCurve ) minVolume = findVolume(minHead);
    else if ( minVolume == 0.0 ) minVolume = (minHead - elev) * area;
    volume = findVolume(head);
    maxVolume = findVolume(maxHead);
    fixedGrade = true;
}